

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::CalcStrainANSbilinearShell(ChElementShellANCF_3423 *this)

{
  Scalar SVar1;
  Scalar SVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChMatrixNM<double,_8,_3> *pCVar5;
  ChElementShellANCF_3423 *this_00;
  pointer pCVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  long index;
  int i;
  long lVar11;
  long lVar12;
  int j;
  long lVar13;
  double dVar14;
  CoeffReturnType CVar15;
  CoeffReturnType CVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ChMatrixNM<double,_1,_3> tmpZ_1;
  ChMatrixNM<double,_1,_3> tmpZ;
  ChMatrixNM<double,_1,_8> Nz;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> knots;
  ChVectorN<double,_8> d0d0Nz;
  ChVectorN<double,_8> ddNz;
  ChMatrixNM<double,_1,_8> Ny;
  ChMatrixNM<double,_1,_8> Nx;
  LhsNested local_260;
  ChMatrixNM<double,_8,_3> *local_258;
  DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *local_248;
  double local_240;
  Scalar local_238;
  DenseCoeffsBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1> *local_230;
  Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
  local_228;
  Matrix<double,_1,_8,_1,_1,_8> *local_210;
  ChMatrixNM<double,_8,_3> *local_208;
  Matrix<double,_1,_8,_1,_1,_8> local_200;
  ChMatrixNM<double,_8,_3> *local_1b8;
  ChMatrixNM<double,_8,_8> *local_1b0;
  ChMatrixNM<double,_8,_8> *local_1a8;
  ChElementShellANCF_3423 *local_1a0;
  _Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_198;
  Matrix<double,_8,_1,_0,_8,_1> local_180;
  Matrix<double,_1,_8,_1,_1,_8> local_140;
  undefined1 local_100 [64];
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
             &local_198,8,(allocator_type *)&stack0xffffffffffffff40);
  local_1b0 = &this->m_d0d0T;
  local_1b8 = &this->m_d;
  (local_198._M_impl.super__Vector_impl_data._M_start)->m_data[0] = (double)&DAT_bff0000000000000;
  (local_198._M_impl.super__Vector_impl_data._M_start)->m_data[1] = (double)&DAT_bff0000000000000;
  (local_198._M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 1.0;
  local_198._M_impl.super__Vector_impl_data._M_start[1].m_data[1] = (double)&DAT_bff0000000000000;
  local_198._M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[2].m_data[0] = (double)&DAT_bff0000000000000;
  local_198._M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 1.0;
  local_198._M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[3].m_data[0] = 1.0;
  local_198._M_impl.super__Vector_impl_data._M_start[3].m_data[1] = 1.0;
  local_198._M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
  dVar14 = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[4].m_data[0] = (double)&DAT_bff0000000000000;
  local_198._M_impl.super__Vector_impl_data._M_start[4].m_data[1] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[5].m_data[0] = 1.0;
  local_198._M_impl.super__Vector_impl_data._M_start[6].m_data[0] = 0.0;
  local_1a8 = &this->m_ddT;
  local_198._M_impl.super__Vector_impl_data._M_start[5].m_data[1] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[6].m_data[1] = (double)&DAT_bff0000000000000;
  local_198._M_impl.super__Vector_impl_data._M_start[6].m_data[2] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[7].m_data[0] = 0.0;
  local_198._M_impl.super__Vector_impl_data._M_start[7].m_data[1] = 1.0;
  local_198._M_impl.super__Vector_impl_data._M_start[7].m_data[2] = 0.0;
  local_248 = (DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)&this->m_strainANS;
  local_230 = (DenseCoeffsBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1> *)&this->m_strainANS_D;
  local_1a0 = this;
  for (index = 0; pCVar6 = local_198._M_impl.super__Vector_impl_data._M_start, this_00 = local_1a0,
      index != 8; index = index + 1) {
    dVar19 = local_198._M_impl.super__Vector_impl_data._M_start[index].m_data[1];
    ShapeFunctionsDerivativeX
              (local_1a0,(ShapeVector *)&stack0xffffffffffffff40,dVar14,dVar19,
               local_198._M_impl.super__Vector_impl_data._M_start[index].m_data[2]);
    ShapeFunctionsDerivativeY
              (this_00,(ShapeVector *)local_100,pCVar6[index].m_data[0],dVar19,
               pCVar6[index].m_data[2]);
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0]
         = 0.0;
    local_228.m_lhs = local_1a8;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
         = 1.0 - pCVar6[index].m_data[1];
    dVar14 = pCVar6[index].m_data[1] + 1.0;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
         = (1.0 - pCVar6[index].m_data[0]) * 0.25;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
         = (pCVar6[index].m_data[0] + 1.0) * 0.25;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[1]
         = local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7] *
           local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
         = local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5] *
           local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
         = local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5] * dVar14;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[2]
         = 0.0;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4]
         = 0.0;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6]
         = 0.0;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
         = local_200.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7] * dVar14;
    local_228.m_rhs.m_matrix = &local_200;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,8,1,0,8,1>,Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
              ((Matrix<double,_8,_1,_0,_8,_1> *)&local_140,&local_228);
    local_228.m_lhs = local_1b0;
    local_228.m_rhs.m_matrix = &local_200;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,8,1,0,8,1>,Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
              (&local_180,&local_228);
    pCVar5 = local_1b8;
    if ((0xfU >> ((uint)index & 0x1f) & 1) == 0) {
      if ((0x30U >> ((uint)index & 0x1f) & 1) == 0) {
        local_228.m_rhs.m_matrix = &local_140;
        local_228.m_lhs = (LhsNested)&stack0xffffffffffffff40;
        CVar15 = Eigen::
                 DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                 ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                          *)&local_228,0,0);
        local_258 = (ChMatrixNM<double,_8,_3> *)&local_180;
        local_260 = (LhsNested)&stack0xffffffffffffff40;
        CVar16 = Eigen::
                 DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                 ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                          *)&local_260,0,0);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                           (local_248,index);
        dVar14 = CVar15 - CVar16;
        *pSVar7 = dVar14;
        local_258 = pCVar5;
        local_260 = (LhsNested)&stack0xffffffffffffff40;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_228,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
                    *)&local_260);
        local_210 = &local_200;
        local_208 = pCVar5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_260,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
                    *)&local_210);
        lVar11 = 0;
        for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
          lVar13 = 0;
          while (lVar13 != 3) {
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                &local_228,0,lVar13);
            SVar1 = *pSVar8;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)
                                &local_200,0,lVar12);
            SVar2 = *pSVar9;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                &local_260,0,lVar13);
            local_238 = *pSVar8;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)
                                &stack0xffffffffffffff40,0,lVar12);
            local_240 = *pSVar9;
            pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1>::operator()
                                (local_230,index,lVar11 + lVar13);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = SVar2;
            lVar13 = lVar13 + 1;
            dVar14 = local_240 * local_238;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = SVar1;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar14;
            auVar4 = vfmadd132sd_fma(auVar21,auVar18,auVar4);
            *pSVar10 = auVar4._0_8_;
          }
          lVar11 = lVar11 + 3;
        }
      }
      else {
        local_228.m_rhs.m_matrix = &local_140;
        local_228.m_lhs = (LhsNested)local_100;
        CVar15 = Eigen::
                 DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                 ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                          *)&local_228,0,0);
        local_258 = (ChMatrixNM<double,_8,_3> *)&local_180;
        local_260 = (LhsNested)local_100;
        CVar16 = Eigen::
                 DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                 ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                          *)&local_260,0,0);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                           (local_248,index);
        local_260 = (LhsNested)local_100;
        dVar14 = CVar15 - CVar16;
        *pSVar7 = dVar14;
        local_258 = pCVar5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_228,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
                    *)&local_260);
        local_210 = &local_200;
        local_208 = pCVar5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_260,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
                    *)&local_210);
        lVar11 = 0;
        for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
          lVar13 = 0;
          while (lVar13 != 3) {
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                &local_228,0,lVar13);
            SVar1 = *pSVar8;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)
                                &local_200,0,lVar12);
            SVar2 = *pSVar9;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                &local_260,0,lVar13);
            local_238 = *pSVar8;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)
                                local_100,0,lVar12);
            local_240 = *pSVar9;
            pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1>::operator()
                                (local_230,index,lVar11 + lVar13);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = SVar2;
            lVar13 = lVar13 + 1;
            dVar14 = local_240 * local_238;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = SVar1;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = dVar14;
            auVar4 = vfmadd132sd_fma(auVar20,auVar17,auVar3);
            *pSVar10 = auVar4._0_8_;
          }
          lVar11 = lVar11 + 3;
        }
      }
    }
    else {
      local_228.m_rhs.m_matrix = &local_140;
      local_228.m_lhs = (LhsNested)&local_200;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
               ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                        *)&local_228,0,0);
      local_258 = (ChMatrixNM<double,_8,_3> *)&local_180;
      local_260 = (LhsNested)&local_200;
      CVar16 = Eigen::
               DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
               ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                        *)&local_260,0,0);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                         (local_248,index);
      local_260 = (LhsNested)&local_200;
      dVar14 = (CVar15 - CVar16) * 0.5;
      *pSVar7 = dVar14;
      local_258 = pCVar5;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_228,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
                  *)&local_260);
      lVar12 = 0;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
        for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&local_228
                              ,0,lVar13);
          dVar19 = *pSVar8;
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_200
                              ,0,lVar11);
          dVar14 = *pSVar9;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1>::operator()
                              (local_230,index,lVar12 + lVar13);
          dVar14 = dVar14 * dVar19;
          *pSVar10 = dVar14;
        }
        lVar12 = lVar12 + 3;
      }
    }
  }
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&local_198);
  return;
}

Assistant:

void ChElementShellANCF_3423::CalcStrainANSbilinearShell() {
    std::vector<ChVector<>> knots(8);

    knots[0] = ChVector<>(-1, -1, 0);
    knots[1] = ChVector<>(1, -1, 0);
    knots[2] = ChVector<>(-1, 1, 0);
    knots[3] = ChVector<>(1, 1, 0);
    knots[4] = ChVector<>(-1, 0, 0);  // A
    knots[5] = ChVector<>(1, 0, 0);   // B
    knots[6] = ChVector<>(0, -1, 0);  // C
    knots[7] = ChVector<>(0, 1, 0);   // D

    ChMatrixNM<double, 1, 8> Nx;
    ChMatrixNM<double, 1, 8> Ny;
    ChMatrixNM<double, 1, 8> Nz;
    ChVectorN<double, 8> ddNz;
    ChVectorN<double, 8> d0d0Nz;

    for (int kk = 0; kk < 8; kk++) {
        ShapeFunctionsDerivativeX(Nx, knots[kk].x(), knots[kk].y(), knots[kk].z());
        ShapeFunctionsDerivativeY(Ny, knots[kk].x(), knots[kk].y(), knots[kk].z());
        ShapeFunctionsDerivativeZ(Nz, knots[kk].x(), knots[kk].y(), knots[kk].z());

        ddNz = m_ddT * Nz.transpose();
        d0d0Nz = m_d0d0T * Nz.transpose();

        switch (kk) {
            case 0:
            case 1:
            case 2:
            case 3: {
                m_strainANS(kk) = 0.5 * ((Nz * ddNz)(0, 0) - (Nz * d0d0Nz)(0, 0));
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpZ(0, j) * Nz(0, i);
                break;
            }
            case 4:
            case 5: {  // => yz
                m_strainANS(kk) = (Ny * ddNz)(0, 0) - (Ny * d0d0Nz)(0, 0);
                ChMatrixNM<double, 1, 3> tmpY = Ny * m_d;
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpY(0, j) * Nz(0, i) + tmpZ(0, j) * Ny(0, i);
                break;
            }
            case 6:
            case 7: {  // => xz
                m_strainANS(kk) = (Nx * ddNz)(0, 0) - (Nx * d0d0Nz)(0, 0);
                ChMatrixNM<double, 1, 3> tmpX = Nx * m_d;
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpX(0, j) * Nz(0, i) + tmpZ(0, j) * Nx(0, i);
                break;
            }
        }
    }
}